

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType baseType,
          Precision precision,ShaderType shaderType)

{
  char *pcVar1;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Precision local_1c;
  Precision local_18;
  ShaderType shaderType_local;
  Precision precision_local;
  DataType baseType_local;
  
  shaderType_local = (ShaderType)this;
  local_1c = precision;
  local_18 = baseType;
  _precision_local = __return_storage_ptr__;
  pcVar1 = glu::getDataTypeName(shaderType_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  pcVar1 = shaderexecutor::anon_unknown_0::getPrecisionPostfix(local_18);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = shaderexecutor::anon_unknown_0::getShaderTypePostfix(local_1c);
  std::operator+(__return_storage_ptr__,&local_40,pcVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

static std::string getCommonFuncCaseName (glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
{
	return string(glu::getDataTypeName(baseType)) + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType);
}